

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnBrIf(TypeChecker *this,Index depth)

{
  bool bVar1;
  Result RVar2;
  TypeVector *pTVar3;
  Label *local_30;
  Label *label;
  Result local_20;
  Index local_1c;
  Result result;
  Index depth_local;
  TypeChecker *this_local;
  
  local_1c = depth;
  _result = this;
  Type::Type((Type *)((long)&label + 4),I32);
  local_20 = PopAndCheck1Type(this,label._4_4_,"br_if");
  RVar2 = GetLabel(this,local_1c,&local_30);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pTVar3 = Label::br_types(local_30);
    RVar2 = PopAndCheckSignature(this,pTVar3,"br_if");
    Result::operator|=(&local_20,RVar2);
    pTVar3 = Label::br_types(local_30);
    PushTypes(this,pTVar3);
    this_local._4_4_ = local_20.enum_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnBrIf(Index depth) {
  Result result = PopAndCheck1Type(Type::I32, "br_if");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= PopAndCheckSignature(label->br_types(), "br_if");
  PushTypes(label->br_types());
  return result;
}